

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O2

void __thiscall
slang::ast::DistExpression::visitExprs<slang::ast::SampledValueExprVisitor&>
          (DistExpression *this,SampledValueExprVisitor *visitor)

{
  pointer pDVar1;
  size_type sVar2;
  long lVar3;
  DistItem *item;
  pointer pDVar4;
  
  Expression::visit<slang::ast::SampledValueExprVisitor&>(this->left_,visitor);
  pDVar1 = (this->items_).data_;
  sVar2 = (this->items_).size_;
  pDVar4 = pDVar1;
  for (lVar3 = 0; sVar2 << 5 != lVar3; lVar3 = lVar3 + 0x20) {
    Expression::visit<slang::ast::SampledValueExprVisitor&>(pDVar4->value,visitor);
    if ((pDVar4->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged
        == true) {
      Expression::visit<slang::ast::SampledValueExprVisitor&>
                (*(Expression **)
                  ((long)&(pDVar1->weight).
                          super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                          _M_payload.
                          super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                          _M_payload + lVar3 + 8),visitor);
    }
    pDVar4 = pDVar4 + 1;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        left().visit(visitor);
        for (auto& item : items_) {
            item.value.visit(visitor);
            if (item.weight)
                item.weight->expr.visit(visitor);
        }
    }